

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O0

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::DeadReckoningCalculator(DeadReckoningCalculator *this)

{
  DeadReckoningCalculator *this_local;
  
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_initPosition);
  DATA_TYPE::Vector::Vector(&this->m_initLinearVelocity);
  DATA_TYPE::Vector::Vector(&this->m_initLinearAcceleration);
  DATA_TYPE::Vector::Vector(&this->m_Ab);
  DATA_TYPE::Vector::Vector(&this->m_quatAxis);
  this->m_f64Magnitude = 0.0;
  DATA_TYPE::EulerAngles::EulerAngles(&this->m_initOrientation);
  DATA_TYPE::EulerAngles::EulerAngles(&this->m_initEulerAngularVelocity);
  Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::Matrix
            (&this->m_initOrientationMatrix);
  Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::Matrix
            (&this->m_initOrientationMatrixTranspose);
  DATA_TYPE::Vector::Vector(&this->m_initAngularVelocity);
  Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::Matrix(&this->m_wwMatrix);
  Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::Matrix(&this->m_SkewOmegaMatrix);
  this->m_DRA = Other_DRA;
  return;
}

Assistant:

DeadReckoningCalculator::DeadReckoningCalculator() :
    m_f64Magnitude( 0 ),
    m_DRA( Other_DRA )
{
}